

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.cc
# Opt level: O1

void X509_VERIFY_PARAM_free(X509_VERIFY_PARAM *param)

{
  if (param != (X509_VERIFY_PARAM *)0x0) {
    OPENSSL_sk_pop_free_ex
              (*(OPENSSL_STACK **)&param->purpose,sk_ASN1_OBJECT_call_free_func,ASN1_OBJECT_free);
    OPENSSL_sk_pop_free_ex
              (*(OPENSSL_STACK **)&param->depth,sk_OPENSSL_STRING_call_free_func,str_free);
    OPENSSL_free(param[1].name);
    OPENSSL_free((void *)param[1].inh_flags);
    OPENSSL_free(param);
    return;
  }
  return;
}

Assistant:

void X509_VERIFY_PARAM_free(X509_VERIFY_PARAM *param) {
  if (param == NULL) {
    return;
  }
  sk_ASN1_OBJECT_pop_free(param->policies, ASN1_OBJECT_free);
  sk_OPENSSL_STRING_pop_free(param->hosts, str_free);
  OPENSSL_free(param->email);
  OPENSSL_free(param->ip);
  OPENSSL_free(param);
}